

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShellPointerArray::UtestShellPointerArray(UtestShellPointerArray *this,UtestShell *firstTest)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 extraout_var;
  size_t size;
  UtestShell **ppUVar3;
  size_t local_38;
  ulong local_28;
  size_t i;
  UtestShell *currentTest;
  UtestShell *firstTest_local;
  UtestShellPointerArray *this_local;
  
  this->arrayOfTests_ = (UtestShell **)0x0;
  this->count_ = 0;
  if (firstTest == (UtestShell *)0x0) {
    local_38 = 0;
  }
  else {
    iVar2 = (*firstTest->_vptr_UtestShell[4])();
    local_38 = CONCAT44(extraout_var,iVar2);
  }
  this->count_ = local_38;
  if (this->count_ != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->count_;
    size = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      size = 0xffffffffffffffff;
    }
    ppUVar3 = (UtestShell **)
              operator_new__(size,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/Utest.cpp"
                             ,0x380);
    this->arrayOfTests_ = ppUVar3;
    i = (size_t)firstTest;
    for (local_28 = 0; local_28 < this->count_; local_28 = local_28 + 1) {
      this->arrayOfTests_[local_28] = (UtestShell *)i;
      i = (**(code **)(*(long *)i + 0x18))();
    }
  }
  return;
}

Assistant:

UtestShellPointerArray::UtestShellPointerArray(UtestShell* firstTest)
    : arrayOfTests_(NULLPTR), count_(0)
{
    count_ = (firstTest) ? firstTest->countTests() : 0;
    if (count_ == 0) return;

    arrayOfTests_ = new UtestShell*[count_];

    UtestShell*currentTest = firstTest;
    for (size_t i = 0; i < count_; i++)
    {
        arrayOfTests_[i] = currentTest;
        currentTest = currentTest->getNext();
    }
}